

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<Reason>::growTo(vec<Reason> *this,uint size,Reason *pad)

{
  anon_union_8_2_743a5d44_for_Reason_0 aVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = (ulong)this->sz;
    if (this->sz < size) {
      aVar1 = pad->field_0;
      do {
        this->data[uVar2].field_0 = aVar1;
        uVar2 = uVar2 + 1;
      } while (size != uVar2);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}